

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

uint32_t Keyset::shuffleBits(uint32_t x)

{
  uint uVar1;
  const_reference pvVar2;
  uint in_EDI;
  int i;
  uint crc;
  size_type in_stack_ffffffffffffffe8;
  int iVar3;
  undefined4 local_8;
  undefined4 local_4;
  
  local_8 = 0;
  local_4 = in_EDI;
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    uVar1 = local_8 << 8;
    rotateLeft<unsigned_int,void>(local_4 ^ local_8,10);
    pvVar2 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)CONCAT44(iVar3,uVar1),
                        in_stack_ffffffffffffffe8);
    local_8 = uVar1 ^ *pvVar2;
    local_4 = local_4 << 8;
  }
  return local_8 ^ 0xffffffff;
}

Assistant:

static uint32_t shuffleBits(uint32_t x)
	{
		auto crc = UINT32_C(0);
		for (auto i = 0; i < 4; ++i) {
			crc = (crc << 8) ^ g_crc32_0x04C11DB7[(rotateLeft(x ^ crc, 10) & 0x3FC) >> 2];
			x <<= 8;
		}
		return ~crc;
	}